

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O1

void ising::free_energy::square::transfer_matrix<double>::fill_D
               (uint_t Ly,real_t Jy,real_t beta,real_t h,
               vector<double,_std::allocator<double>_> *diag,
               vector<double,_std::allocator<double>_> *diag_10,
               vector<double,_std::allocator<double>_> *diag_20,
               vector<double,_std::allocator<double>_> *diag_01,
               vector<double,_std::allocator<double>_> *diag_02)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  byte bVar7;
  byte bVar8;
  uint_t uVar9;
  ulong uVar10;
  ulong uVar11;
  size_type sVar12;
  ulong uVar13;
  size_type __new_size;
  bool bVar14;
  double dVar15;
  ulong in_XMM1_Qb;
  double dVar16;
  double dVar17;
  array<double,_2UL> weight;
  double local_88 [2];
  real_t local_78;
  ulong uStack_70;
  vector<double,_std::allocator<double>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  double local_48;
  ulong uStack_40;
  
  __new_size = (size_type)(1 << ((byte)Ly & 0x1f));
  local_78 = beta;
  uStack_70 = in_XMM1_Qb;
  std::vector<double,_std::allocator<double>_>::resize(diag,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(diag_10,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(diag_20,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(diag_01,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(diag_02,__new_size);
  pdVar1 = (diag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (diag_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (diag_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (diag_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (diag_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar12 = 0;
  do {
    pdVar1[sVar12] = 1.0;
    pdVar2[sVar12] = 1.0;
    pdVar3[sVar12] = 1.0;
    pdVar4[sVar12] = 1.0;
    pdVar5[sVar12] = 1.0;
    sVar12 = sVar12 + 1;
  } while (__new_size != sVar12);
  local_60 = diag;
  local_58 = diag_10;
  local_50 = diag_20;
  local_88[0] = exp(Jy * local_78);
  local_48 = -local_78;
  uStack_40 = uStack_70 ^ 0x8000000000000000;
  local_88[1] = exp(local_48 * Jy);
  pvVar6 = local_60;
  pdVar1 = (local_60->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  do {
    dVar15 = pdVar1[uVar11];
    if (Ly != 0) {
      uVar9 = 0;
      do {
        bVar7 = (byte)uVar9;
        bVar14 = Ly - 1 == uVar9;
        uVar9 = uVar9 + 1;
        bVar8 = (byte)uVar9;
        if (bVar14) {
          bVar8 = 0;
        }
        dVar15 = dVar15 * local_88[((uint)(uVar11 >> (bVar8 & 0x3f)) ^
                                   (uint)(uVar11 >> (bVar7 & 0x3f))) & 1];
      } while (Ly != uVar9);
    }
    pdVar1[uVar11] = dVar15;
    uVar11 = uVar11 + 1;
  } while (uVar11 != __new_size);
  local_88[0] = exp(local_78 * h);
  local_88[1] = exp(local_48 * h);
  pdVar1 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  do {
    dVar15 = pdVar1[uVar11];
    if (Ly != 0) {
      uVar10 = 0;
      do {
        dVar15 = dVar15 * local_88[(uVar11 >> (uVar10 & 0x3f) & 1) != 0];
        uVar10 = uVar10 + 1;
      } while (Ly != uVar10);
    }
    pdVar1[uVar11] = dVar15;
    uVar11 = uVar11 + 1;
  } while (uVar11 != __new_size);
  pdVar1 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  do {
    dVar15 = 0.0;
    if (Ly != 0) {
      uVar10 = 0;
      do {
        bVar14 = Ly - 1 == uVar10;
        dVar16 = (double)((uVar11 >> (uVar10 & 0x3f) & 1) != 0);
        uVar10 = uVar10 + 1;
        uVar13 = uVar10 & 0xffffffff;
        if (bVar14) {
          uVar13 = 0;
        }
        dVar17 = (double)((uVar11 >> (uVar13 & 0x3f) & 1) != 0);
        dVar15 = dVar15 + (1.0 - (dVar17 + dVar17)) * (1.0 - (dVar16 + dVar16)) * Jy;
      } while (Ly != uVar10);
    }
    if (Ly != 0) {
      uVar10 = 0;
      do {
        dVar16 = (double)((uVar11 >> (uVar10 & 0x3f) & 1) != 0);
        dVar15 = dVar15 + (1.0 - (dVar16 + dVar16)) * h;
        uVar10 = uVar10 + 1;
      } while (Ly != uVar10);
    }
    pdVar2[uVar11] = pdVar1[uVar11] * dVar15;
    pdVar3[uVar11] = pdVar1[uVar11] * dVar15 * dVar15;
    uVar11 = uVar11 + 1;
  } while (uVar11 != __new_size);
  pdVar1 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (diag_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (diag_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  do {
    dVar15 = 0.0;
    if (Ly != 0) {
      uVar10 = 0;
      do {
        dVar16 = (double)((uVar11 >> (uVar10 & 0x3f) & 1) != 0);
        dVar15 = dVar15 + (1.0 - (dVar16 + dVar16)) * local_78;
        uVar10 = uVar10 + 1;
      } while (Ly != uVar10);
    }
    pdVar2[uVar11] = pdVar1[uVar11] * dVar15;
    pdVar3[uVar11] = pdVar1[uVar11] * dVar15 * dVar15;
    uVar11 = uVar11 + 1;
  } while (uVar11 != __new_size);
  return;
}

Assistant:

static void fill_D(uint_t Ly, real_t Jy, real_t beta, real_t h,
                     std::vector<real_t> &diag, std::vector<real_t> &diag_10,
                     std::vector<real_t> &diag_20, std::vector<real_t> &diag_01,
                     std::vector<real_t> &diag_02) {
    uint_t dim = 1 << Ly;
    diag.resize(dim);
    diag_10.resize(dim);
    diag_20.resize(dim);
    diag_01.resize(dim);
    diag_02.resize(dim);
    for (uint_t c = 0; c < dim; ++c) {
      diag[c] = 1;
      diag_10[c] = 1;
      diag_20[c] = 1;
      diag_01[c] = 1;
      diag_02[c] = 1;
    }
    boost::array<real_t, 2> weight;
    weight[0] = std::exp(beta * Jy);
    weight[1] = std::exp(-beta * Jy);
    for (uint_t c = 0; c < dim; ++c) {
      real_t elem = diag[c];
      for (uint_t b = 0; b < Ly; ++b) {
        uint_t s0 = b;
        uint_t s1 = (b + 1) % Ly;
        elem *= weight[((c >> s0) & 1) ^ ((c >> s1) & 1)];
      }
      diag[c] = elem;
    }
    weight[0] = std::exp(beta * h);
    weight[1] = std::exp(-beta * h);
    for (uint_t c = 0; c < dim; ++c) {
      real_t elem = diag[c];
      for (uint_t s = 0; s < Ly; ++s) {
        elem *= weight[((c >> s) & 1)];
      }
      diag[c] = elem;
    }
    for (uint_t c = 0; c < dim; ++c) {
      real_t factor = 0;
      for (uint_t b = 0; b < Ly; ++b) {
        uint_t s0 = b;
        uint_t s1 = (b + 1) % Ly;
        factor +=
            Jy * (-2.0 * ((c >> s0) & 1) + 1) * (-2.0 * ((c >> s1) & 1) + 1);
      }
      for (uint_t s = 0; s < Ly; ++s) {
        factor += h * (-2.0 * ((c >> s) & 1) + 1);
      }
      diag_10[c] = diag[c] * factor;
      diag_20[c] = diag[c] * factor * factor;
    }
    for (uint_t c = 0; c < dim; ++c) {
      real_t factor = 0;
      for (uint_t s = 0; s < Ly; ++s) {
        factor += beta * (-2.0 * ((c >> s) & 1) + 1);
      }
      diag_01[c] = diag[c] * factor;
      diag_02[c] = diag[c] * factor * factor;
    }
  }